

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::
     RenderPrimitives<ImPlot::RectRenderer<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>>
               (RectRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin> *renderer,
               ImDrawList *DrawList,ImRect *cull_rect)

{
  double dVar1;
  double dVar2;
  int iVar3;
  ImVec2 IVar4;
  GetterXsYs<double> *pGVar5;
  uint *puVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ImDrawVert *pIVar14;
  int iVar15;
  int iVar16;
  double dVar17;
  ImVec2 IVar18;
  ImVec2 IVar19;
  ImVec2 IVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ImVec2 IVar24;
  uint local_54;
  
  local_54 = renderer->Prims;
  if (local_54 != 0) {
    IVar4 = DrawList->_Data->TexUvWhitePixel;
    iVar15 = 0;
    uVar12 = 0;
    do {
      uVar9 = ~DrawList->_VtxCurrentIdx >> 2;
      uVar13 = uVar9;
      if (local_54 < uVar9) {
        uVar13 = local_54;
      }
      uVar11 = 0x40;
      if (local_54 < 0x40) {
        uVar11 = local_54;
      }
      if (uVar9 < uVar11) {
        if (uVar12 != 0) {
          ImDrawList::PrimUnreserve(DrawList,uVar12 * 6,uVar12 << 2);
        }
        uVar12 = 0x3fffffff;
        uVar13 = 0x3fffffff;
        if (local_54 < 0x3fffffff) {
          uVar12 = local_54;
          uVar13 = local_54;
        }
LAB_0041aed4:
        ImDrawList::PrimReserve(DrawList,uVar12 * 6,uVar12 << 2);
        local_54 = local_54 - uVar13;
        uVar12 = 0;
LAB_0041aefb:
        iVar7 = uVar13 + iVar15;
        pIVar14 = DrawList->_VtxWritePtr;
        iVar16 = iVar15 * 2;
        do {
          pGVar5 = renderer->Getter;
          iVar15 = pGVar5->Count;
          iVar3 = renderer->Transformer->YAxis;
          IVar18 = GImPlot->PixelRange[iVar3].Min;
          dVar17 = (double)IVar18.x;
          dVar21 = (double)IVar18.y;
          dVar1 = (GImPlot->CurrentPlot->XAxis).Range.Min;
          dVar2 = GImPlot->CurrentPlot->YAxis[iVar3].Range.Min;
          lVar8 = (long)(((iVar16 + pGVar5->Offset) % iVar15 + iVar15) % iVar15) *
                  (long)pGVar5->Stride;
          lVar10 = (long)(((iVar16 + pGVar5->Offset + 1) % iVar15 + iVar15) % iVar15) *
                   (long)pGVar5->Stride;
          dVar22 = (*(double *)((long)pGVar5->Xs + lVar8) - dVar1) * GImPlot->Mx + dVar17;
          dVar23 = (*(double *)((long)pGVar5->Ys + lVar10) - dVar2) * GImPlot->My[iVar3] + dVar21;
          dVar17 = (*(double *)((long)pGVar5->Xs + lVar10) - dVar1) * GImPlot->Mx + dVar17;
          dVar21 = (*(double *)((long)pGVar5->Ys + lVar8) - dVar2) * GImPlot->My[iVar3] + dVar21;
          IVar18.x = (float)dVar22;
          IVar18.y = (float)dVar21;
          pIVar14->pos = IVar18;
          DrawList->_VtxWritePtr->uv = IVar4;
          IVar19.x = (float)dVar22;
          IVar19.y = (float)dVar23;
          pIVar14 = DrawList->_VtxWritePtr;
          IVar24.x = (float)dVar17;
          IVar24.y = (float)dVar21;
          pIVar14->col = renderer->Col;
          pIVar14[1].pos = IVar19;
          pIVar14[1].uv = IVar4;
          pIVar14 = DrawList->_VtxWritePtr;
          IVar20.x = (float)dVar17;
          IVar20.y = (float)dVar23;
          pIVar14[1].col = renderer->Col;
          pIVar14[2].pos = IVar20;
          DrawList->_VtxWritePtr[2].uv = IVar4;
          pIVar14 = DrawList->_VtxWritePtr;
          pIVar14[2].col = renderer->Col;
          pIVar14[3].pos = IVar24;
          pIVar14[3].uv = IVar4;
          pIVar14 = DrawList->_VtxWritePtr;
          pIVar14[3].col = renderer->Col;
          pIVar14 = pIVar14 + 4;
          DrawList->_VtxWritePtr = pIVar14;
          uVar9 = DrawList->_VtxCurrentIdx;
          puVar6 = DrawList->_IdxWritePtr;
          *puVar6 = uVar9;
          puVar6[1] = uVar9 + 1;
          puVar6[2] = DrawList->_VtxCurrentIdx + 3;
          puVar6[3] = DrawList->_VtxCurrentIdx + 1;
          puVar6[4] = DrawList->_VtxCurrentIdx + 2;
          puVar6[5] = DrawList->_VtxCurrentIdx + 3;
          DrawList->_IdxWritePtr = puVar6 + 6;
          DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 4;
          iVar16 = iVar16 + 2;
          uVar13 = uVar13 - 1;
          iVar15 = iVar7;
        } while (uVar13 != 0);
      }
      else {
        uVar9 = uVar12 - uVar13;
        if (uVar12 < uVar13) {
          uVar12 = uVar13 - uVar12;
          goto LAB_0041aed4;
        }
        local_54 = local_54 - uVar13;
        uVar12 = uVar9;
        if (DrawList->_VtxCurrentIdx < 0xfffffffc) goto LAB_0041aefb;
      }
    } while (local_54 != 0);
    if (uVar12 != 0) {
      ImDrawList::PrimUnreserve(DrawList,uVar12 * 6,uVar12 << 2);
      return;
    }
  }
  return;
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}